

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

int tcu::astc::anon_unknown_0::computeNumColorEndpointValues
              (deUint32 *endpointModes,int numPartitions,bool isMultiPartSingleCemMode)

{
  int iVar1;
  ulong uVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  
  if ((int)CONCAT71(in_register_00000011,isMultiPartSingleCemMode) == 0) {
    uVar2 = 0;
    uVar3 = (ulong)(uint)numPartitions;
    if (numPartitions < 1) {
      uVar3 = uVar2;
    }
    iVar1 = 0;
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      iVar1 = iVar1 + (endpointModes[uVar2] >> 2) * 2 + 2;
    }
  }
  else {
    iVar1 = ((*endpointModes >> 2) * 2 + 2) * numPartitions;
  }
  return iVar1;
}

Assistant:

static inline int computeNumColorEndpointValues (const deUint32* endpointModes, int numPartitions, bool isMultiPartSingleCemMode)
{
	if (isMultiPartSingleCemMode)
		return numPartitions * computeNumColorEndpointValues(endpointModes[0]);
	else
	{
		int result = 0;
		for (int i = 0; i < numPartitions; i++)
			result += computeNumColorEndpointValues(endpointModes[i]);
		return result;
	}
}